

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::NegativeGLSLCompileTimeErrors::Run(NegativeGLSLCompileTimeErrors *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  int in_R8D;
  GLint z;
  GLint y;
  GLint x;
  string local_60;
  int local_3c;
  int local_38;
  int local_34;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "#version 420 core\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
             ,"");
  bVar2 = Compile(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  lVar3 = -1;
  if (bVar2) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(local_size_x = 2) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
               ,"");
    bVar2 = Compile(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "#version 430 core\nlayout(local_size_x = 1) in;\nin uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = x;\n}"
                 ,"");
      bVar2 = Compile(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "#version 430 core\nlayout(local_size_x = 1) in;\nout uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n  x = 0;\n}"
                   ,"");
        bVar2 = Compile(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper;
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&local_34);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&local_38);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&local_3c);
          gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                    (&local_60,(NegativeGLSLCompileTimeErrors *)(ulong)(local_34 + 1),1,1,in_R8D);
          bVar2 = Compile(this,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar1) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                      (&local_60,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,local_38 + 1,1,
                       in_R8D);
            bVar2 = Compile(this,&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != paVar1) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              gl4cts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                        (&local_60,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,1,local_3c + 1,
                         in_R8D);
              bVar2 = Compile(this,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != paVar1) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar2) {
                lVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		// gl_GlobalInvocationID requires "#version 430" or later or GL_ARB_compute_shader
		// extension enabled
		if (!Compile("#version 420 core" NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL
					 "  uint g_output[];" NL "};" NL "void main() {" NL "  g_output[gl_GlobalInvocationID.x] = 0;" NL
					 "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(local_size_x = 2) in;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "in uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = x;" NL "}"))
			return ERROR;

		if (!Compile("#version 430 core" NL "layout(local_size_x = 1) in;" NL "out uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "  x = 0;" NL "}"))
			return ERROR;

		{
			GLint x, y, z;
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &x);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &y);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &z);

			if (!Compile(Shader1(x + 1, 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, y + 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, 1, z + 1)))
				return ERROR;
		}

		return NO_ERROR;
	}